

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::SharedDtor(ItemSimilarityRecommender *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->iteminputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->numrecommendationsinputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->itemrestrictioninputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->itemexclusioninputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->recommendeditemlistoutputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->recommendeditemscoreoutputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if (this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    if (this->itemstringids_ != (StringVector *)0x0) {
      (*(this->itemstringids_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->itemint64ids_ != (Int64Vector *)0x0) {
      (*(this->itemint64ids_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::SharedDtor() {
  iteminputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  numrecommendationsinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  itemrestrictioninputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  itemexclusioninputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  recommendeditemlistoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  recommendeditemscoreoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete itemstringids_;
  }
  if (this != internal_default_instance()) {
    delete itemint64ids_;
  }
}